

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

int * __thiscall
frozen::
unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
::
at<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
          (unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
          equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  size_t __n;
  int iVar1;
  size_t sVar2;
  out_of_range *this_00;
  
  sVar2 = bits::pmh_tables<128ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
          ::
          lookup<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<128ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)(this + 0x680),key,hash);
  __n = *(size_t *)(this + sVar2 * 0x18 + 8);
  if (__n == key->_M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp(*(void **)(this + sVar2 * 0x18 + 0x10),(key->_M_dataplus)._M_p,__n);
      if (iVar1 != 0) goto LAB_0028e3da;
    }
    return (int *)(this + sVar2 * 0x18 + 0x18);
  }
LAB_0028e3da:
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"unknown key");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

constexpr Value const &at(KeyType const &key, Hasher const &hash, Equal const &equal) const {
    return at_impl(*this, key, hash, equal);
  }